

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

Box * __thiscall amrex::BoxArray::minimalBox(BoxArray *this,Long *npts_avg_box)

{
  undefined8 uVar1;
  IndexType IVar2;
  uint uVar3;
  Long LVar4;
  Box *pBVar5;
  byte bVar6;
  int iVar7;
  long *in_RDX;
  IndexType *pIVar8;
  Box *in_RDI;
  IntVect IVar9;
  IntVect cr;
  int i_2;
  Long npts;
  int i_1;
  int tid;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> bxs;
  int i;
  int nthreads;
  bool use_single_thread;
  Long npts_tot;
  int N;
  int dir;
  IntVect off;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  BoxArray *in_stack_fffffffffffffc08;
  Box *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  int local_3d8;
  int local_3d4;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_394;
  int local_390;
  int local_38c;
  int local_384;
  int local_380;
  int local_37c;
  int local_36c;
  int local_368;
  int local_364;
  int local_35c;
  int local_358;
  int local_354;
  int local_34c;
  int local_348;
  int local_344;
  bool local_319;
  undefined8 local_2d8;
  int local_2d0;
  undefined8 local_2c8;
  int local_2c0;
  int local_274;
  undefined4 local_270;
  undefined1 local_269;
  long local_268;
  int local_25c;
  long *local_258;
  int local_248;
  IntVect local_244;
  int *local_238;
  int local_21c;
  int local_1f4;
  IntVect *local_1f0;
  int local_1b4;
  int *local_1b0;
  IntVect *local_1a8;
  IntVect *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  IntVect *local_180;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  int *local_160;
  int *local_158;
  IntVect *local_150;
  int *local_148;
  IntVect *local_140;
  int *local_138;
  IndexType *local_128;
  int local_fc;
  IndexType *local_f8;
  undefined4 local_f0;
  int local_ec;
  IntVect *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  IndexType *local_70;
  int local_3c;
  
  local_258 = in_RDX;
  Box::Box(in_stack_fffffffffffffc10);
  LVar4 = size((BoxArray *)0xfc7a4c);
  local_25c = (int)LVar4;
  local_268 = 0;
  if (0 < local_25c) {
    local_269 = 1;
    local_270 = 1;
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfc7a9f);
    pBVar5 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                       ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffc10
                        ,(size_type)in_stack_fffffffffffffc08);
    *(undefined8 *)(in_RDI->smallend).vect = *(undefined8 *)(pBVar5->smallend).vect;
    *(undefined8 *)((in_RDI->smallend).vect + 2) = *(undefined8 *)((pBVar5->smallend).vect + 2);
    *(undefined8 *)((in_RDI->bigend).vect + 1) = *(undefined8 *)((pBVar5->bigend).vect + 1);
    (in_RDI->btype).itype = (pBVar5->btype).itype;
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfc7ae3);
    Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffc10,
               (size_type)in_stack_fffffffffffffc08);
    LVar4 = Box::numPts((Box *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    local_268 = LVar4 + local_268;
    for (local_274 = 1; local_274 < local_25c; local_274 = local_274 + 1) {
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfc7b37);
      pBVar5 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                         ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                          in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
      Box::minBox(in_RDI,pBVar5);
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfc7b68);
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffc10,
                 (size_type)in_stack_fffffffffffffc08);
      LVar4 = Box::numPts((Box *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
      local_268 = LVar4 + local_268;
    }
  }
  IVar9 = crseRatio((BoxArray *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  local_2d8 = IVar9.vect._0_8_;
  local_2c8 = local_2d8;
  uVar1 = local_2c8;
  local_2d0 = IVar9.vect[2];
  local_2c0 = local_2d0;
  local_238 = (int *)&local_2c8;
  local_164 = 1;
  local_2c8._0_4_ = IVar9.vect[0];
  local_319 = true;
  local_2c8._4_4_ = IVar9.vect[1];
  if (((int)local_2c8 == 1) && (local_319 = true, local_2c8._4_4_ == 1)) {
    local_319 = local_2d0 != 1;
  }
  local_160 = local_238;
  if (local_319) {
    local_c4 = (in_RDI->smallend).vect[0];
    local_c8 = (int)local_2c8;
    local_c0 = local_c4;
    if ((int)local_2c8 != 1) {
      if ((int)local_2c8 == 2) {
        if (local_c4 < 0) {
          iVar7 = local_c4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_344 = -iVar7 / 2 + -1;
        }
        else {
          local_344 = local_c4 / 2;
        }
        local_c0 = local_344;
      }
      else if ((int)local_2c8 == 4) {
        if (local_c4 < 0) {
          iVar7 = local_c4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_348 = -iVar7 / 4 + -1;
        }
        else {
          local_348 = local_c4 / 4;
        }
        local_c0 = local_348;
      }
      else {
        if (local_c4 < 0) {
          iVar7 = local_c4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_34c = -iVar7 / (int)local_2c8 + -1;
        }
        else {
          local_34c = local_c4 / (int)local_2c8;
        }
        local_c0 = local_34c;
      }
    }
    (in_RDI->smallend).vect[0] = local_c0;
    local_d0 = (in_RDI->smallend).vect[1];
    local_d4 = local_2c8._4_4_;
    local_cc = local_d0;
    if (local_2c8._4_4_ != 1) {
      if (local_2c8._4_4_ == 2) {
        if (local_d0 < 0) {
          iVar7 = local_d0 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_354 = -iVar7 / 2 + -1;
        }
        else {
          local_354 = local_d0 / 2;
        }
        local_cc = local_354;
      }
      else if (local_2c8._4_4_ == 4) {
        if (local_d0 < 0) {
          iVar7 = local_d0 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_358 = -iVar7 / 4 + -1;
        }
        else {
          local_358 = local_d0 / 4;
        }
        local_cc = local_358;
      }
      else {
        if (local_d0 < 0) {
          iVar7 = local_d0 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_35c = -iVar7 / local_2c8._4_4_ + -1;
        }
        else {
          local_35c = local_d0 / local_2c8._4_4_;
        }
        local_cc = local_35c;
      }
    }
    (in_RDI->smallend).vect[1] = local_cc;
    local_dc = (in_RDI->smallend).vect[2];
    local_e0 = local_2d0;
    local_d8 = local_dc;
    if (local_2d0 != 1) {
      if (local_2d0 == 2) {
        if (local_dc < 0) {
          iVar7 = local_dc + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_364 = -iVar7 / 2 + -1;
        }
        else {
          local_364 = local_dc / 2;
        }
        local_d8 = local_364;
      }
      else if (local_2d0 == 4) {
        if (local_dc < 0) {
          iVar7 = local_dc + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_368 = -iVar7 / 4 + -1;
        }
        else {
          local_368 = local_dc / 4;
        }
        local_d8 = local_368;
      }
      else {
        if (local_dc < 0) {
          iVar7 = local_dc + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_36c = -iVar7 / local_2d0 + -1;
        }
        else {
          local_36c = local_dc / local_2d0;
        }
        local_d8 = local_36c;
      }
    }
    (in_RDI->smallend).vect[2] = local_d8;
    local_128 = &in_RDI->btype;
    local_138 = local_238;
    if (local_128->itype == 0) {
      local_140 = &in_RDI->bigend;
      local_a0 = local_140->vect[0];
      local_a4 = (int)local_2c8;
      local_9c = local_a0;
      if ((int)local_2c8 != 1) {
        if ((int)local_2c8 == 2) {
          if (local_a0 < 0) {
            iVar7 = local_a0 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3b4 = -iVar7 / 2 + -1;
          }
          else {
            local_3b4 = local_a0 / 2;
          }
          local_9c = local_3b4;
        }
        else if ((int)local_2c8 == 4) {
          if (local_a0 < 0) {
            iVar7 = local_a0 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3b8 = -iVar7 / 4 + -1;
          }
          else {
            local_3b8 = local_a0 / 4;
          }
          local_9c = local_3b8;
        }
        else {
          if (local_a0 < 0) {
            iVar7 = local_a0 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3bc = -iVar7 / (int)local_2c8 + -1;
          }
          else {
            local_3bc = local_a0 / (int)local_2c8;
          }
          local_9c = local_3bc;
        }
      }
      local_140->vect[0] = local_9c;
      local_ac = (in_RDI->bigend).vect[1];
      local_b0 = local_2c8._4_4_;
      local_a8 = local_ac;
      if (local_2c8._4_4_ != 1) {
        if (local_2c8._4_4_ == 2) {
          if (local_ac < 0) {
            iVar7 = local_ac + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3c4 = -iVar7 / 2 + -1;
          }
          else {
            local_3c4 = local_ac / 2;
          }
          local_a8 = local_3c4;
        }
        else if (local_2c8._4_4_ == 4) {
          if (local_ac < 0) {
            iVar7 = local_ac + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3c8 = -iVar7 / 4 + -1;
          }
          else {
            local_3c8 = local_ac / 4;
          }
          local_a8 = local_3c8;
        }
        else {
          if (local_ac < 0) {
            iVar7 = local_ac + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3cc = -iVar7 / local_2c8._4_4_ + -1;
          }
          else {
            local_3cc = local_ac / local_2c8._4_4_;
          }
          local_a8 = local_3cc;
        }
      }
      (in_RDI->bigend).vect[1] = local_a8;
      local_b8 = (in_RDI->bigend).vect[2];
      local_bc = local_2d0;
      local_b4 = local_b8;
      if (local_2d0 != 1) {
        if (local_2d0 == 2) {
          if (local_b8 < 0) {
            iVar7 = local_b8 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3d4 = -iVar7 / 2 + -1;
          }
          else {
            local_3d4 = local_b8 / 2;
          }
          local_b4 = local_3d4;
        }
        else if (local_2d0 == 4) {
          if (local_b8 < 0) {
            iVar7 = local_b8 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3d8 = -iVar7 / 4 + -1;
          }
          else {
            local_3d8 = local_b8 / 4;
          }
          local_b4 = local_3d8;
        }
        else if (local_b8 < 0) {
          iVar7 = local_b8 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_b4 = -iVar7 / local_2d0 + -1;
        }
        else {
          local_b4 = local_b8 / local_2d0;
        }
      }
      (in_RDI->bigend).vect[2] = local_b4;
      local_148 = local_238;
    }
    else {
      local_2c8 = uVar1;
      IntVect::IntVect(&local_244,0);
      for (local_248 = 0; local_248 < 3; local_248 = local_248 + 1) {
        local_f8 = &in_RDI->btype;
        local_fc = local_248;
        local_74 = local_248;
        local_3c = local_248;
        if ((local_f8->itype & 1 << ((byte)local_248 & 0x1f)) != 0) {
          local_1f0 = &in_RDI->bigend;
          local_1f4 = local_248;
          local_1b0 = local_238;
          local_1b4 = local_248;
          if (local_1f0->vect[local_248] % local_238[local_248] != 0) {
            local_e8 = &local_244;
            local_ec = local_248;
            local_f0 = 1;
            local_e8->vect[local_248] = 1;
          }
        }
        local_70 = local_f8;
      }
      local_150 = &in_RDI->bigend;
      local_158 = local_238;
      local_7c = local_150->vect[0];
      local_80 = *local_238;
      local_78 = local_7c;
      if (local_80 != 1) {
        if (local_80 == 2) {
          if (local_7c < 0) {
            iVar7 = local_7c + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_37c = -iVar7 / 2 + -1;
          }
          else {
            local_37c = local_7c / 2;
          }
          local_78 = local_37c;
        }
        else if (local_80 == 4) {
          if (local_7c < 0) {
            iVar7 = local_7c + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_380 = -iVar7 / 4 + -1;
          }
          else {
            local_380 = local_7c / 4;
          }
          local_78 = local_380;
        }
        else {
          if (local_7c < 0) {
            iVar7 = local_7c + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_384 = -iVar7 / local_80 + -1;
          }
          else {
            local_384 = local_7c / local_80;
          }
          local_78 = local_384;
        }
      }
      local_150->vect[0] = local_78;
      local_88 = (in_RDI->bigend).vect[1];
      local_8c = local_238[1];
      local_84 = local_88;
      if (local_8c != 1) {
        if (local_8c == 2) {
          if (local_88 < 0) {
            iVar7 = local_88 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_38c = -iVar7 / 2 + -1;
          }
          else {
            local_38c = local_88 / 2;
          }
          local_84 = local_38c;
        }
        else if (local_8c == 4) {
          if (local_88 < 0) {
            iVar7 = local_88 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_390 = -iVar7 / 4 + -1;
          }
          else {
            local_390 = local_88 / 4;
          }
          local_84 = local_390;
        }
        else {
          if (local_88 < 0) {
            iVar7 = local_88 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_394 = -iVar7 / local_8c + -1;
          }
          else {
            local_394 = local_88 / local_8c;
          }
          local_84 = local_394;
        }
      }
      (in_RDI->bigend).vect[1] = local_84;
      local_94 = (in_RDI->bigend).vect[2];
      local_98 = local_238[2];
      local_90 = local_94;
      if (local_98 != 1) {
        if (local_98 == 2) {
          if (local_94 < 0) {
            iVar7 = local_94 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_39c = -iVar7 / 2 + -1;
          }
          else {
            local_39c = local_94 / 2;
          }
          local_90 = local_39c;
        }
        else if (local_98 == 4) {
          if (local_94 < 0) {
            iVar7 = local_94 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3a0 = -iVar7 / 4 + -1;
          }
          else {
            local_3a0 = local_94 / 4;
          }
          local_90 = local_3a0;
        }
        else {
          if (local_94 < 0) {
            iVar7 = local_94 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_3a4 = -iVar7 / local_98 + -1;
          }
          else {
            local_3a4 = local_94 / local_98;
          }
          local_90 = local_3a4;
        }
      }
      (in_RDI->bigend).vect[2] = local_90;
      local_1a0 = &in_RDI->bigend;
      local_1a8 = &local_244;
      local_174 = 0;
      local_1a0->vect[0] = local_244.vect[0] + local_1a0->vect[0];
      local_184 = 1;
      (in_RDI->bigend).vect[1] = local_244.vect[1] + (in_RDI->bigend).vect[1];
      local_194 = 2;
      (in_RDI->bigend).vect[2] = local_244.vect[2] + (in_RDI->bigend).vect[2];
      uVar1 = local_2c8;
      local_190 = local_1a8;
      local_180 = local_1a8;
      local_170 = local_1a8;
    }
  }
  local_2c8 = uVar1;
  IVar2 = ixType(in_stack_fffffffffffffc08);
  for (local_21c = 0; local_21c < 3; local_21c = local_21c + 1) {
    bVar6 = (byte)local_21c;
    uVar3 = (uint)((IVar2.itype & 1 << (bVar6 & 0x1f)) != 0);
    (in_RDI->bigend).vect[local_21c] =
         (uVar3 - (((in_RDI->btype).itype & 1 << (bVar6 & 0x1f)) != 0)) +
         (in_RDI->bigend).vect[local_21c];
    pIVar8 = &in_RDI->btype;
    if (uVar3 == 0) {
      pIVar8->itype = (1 << (bVar6 & 0x1f) ^ 0xffffffffU) & pIVar8->itype;
    }
    else {
      pIVar8->itype = 1 << (bVar6 & 0x1f) | pIVar8->itype;
    }
  }
  *local_258 = (local_268 / (long)((int)local_2c8 * local_2c8._4_4_ * local_2c0)) / (long)local_25c;
  return in_RDI;
}

Assistant:

Box
BoxArray::minimalBox (Long& npts_avg_box) const
{
    BL_ASSERT(m_bat.is_simple());
    Box minbox;
    const int N = size();
    Long npts_tot = 0;
    if (N > 0)
    {
#ifdef AMREX_USE_OMP
        bool use_single_thread = omp_in_parallel();
        const int nthreads = use_single_thread ? 1 : omp_get_max_threads();
#else
        bool use_single_thread = true;
        const int nthreads = 1;
#endif
        if (use_single_thread)
        {
            minbox = m_ref->m_abox[0];
            npts_tot += m_ref->m_abox[0].numPts();
            for (int i = 1; i < N; ++i) {
                minbox.minBox(m_ref->m_abox[i]);
                npts_tot += m_ref->m_abox[i].numPts();
            }
        }
        else
        {
            Vector<Box> bxs(nthreads, m_ref->m_abox[0]);
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:npts_tot)
#endif
            {
                int tid = OpenMP::get_thread_num();
#ifdef AMREX_USE_OMP
#pragma omp for
#endif
                for (int i = 0; i < N; ++i) {
                    bxs[tid].minBox(m_ref->m_abox[i]);
                    Long npts = m_ref->m_abox[i].numPts();
                    npts_tot += npts;
                }
            }
            minbox = bxs[0];
            for (int i = 1; i < nthreads; ++i) {
                minbox.minBox(bxs[i]);
            }
        }
    }
    auto cr = crseRatio();
    minbox.coarsen(cr).convert(ixType());
    npts_tot /= AMREX_D_TERM(cr[0],*cr[1],*cr[2]);
    npts_avg_box = npts_tot / N;
    return minbox;
}